

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::api::json::DecodeUnlockingScript::DecodeUnlockingScript(DecodeUnlockingScript *this)

{
  JsonClassBase<cfd::api::json::DecodeUnlockingScript> *in_RDI;
  allocator local_1d [20];
  allocator local_9 [9];
  
  core::JsonClassBase<cfd::api::json::DecodeUnlockingScript>::JsonClassBase(in_RDI);
  in_RDI->_vptr_JsonClassBase = (_func_int **)&PTR__DecodeUnlockingScript_009f7d98;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x645515);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 7),"",local_9);
  std::allocator<char>::~allocator((allocator<char> *)local_9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0xb),"",local_1d);
  std::allocator<char>::~allocator((allocator<char> *)local_1d);
  CollectFieldName();
  return;
}

Assistant:

DecodeUnlockingScript() {
    CollectFieldName();
  }